

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wav_header.cc
# Opt level: O1

bool webrtc::ReadWavHeader
               (ReadableWav *readable,size_t *num_channels,int *sample_rate,WavFormat *format,
               size_t *bytes_per_sample,size_t *num_samples)

{
  size_t num_channels_00;
  size_t bytes_per_sample_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int16_t ext_size;
  WavHeader header;
  undefined4 *local_88;
  undefined8 local_80;
  undefined4 local_78;
  undefined1 local_74;
  undefined4 local_64;
  uint local_60;
  undefined4 local_5c;
  undefined4 local_58;
  int local_54;
  ushort local_50;
  ushort local_4e;
  int local_4c;
  int local_48;
  short local_44;
  ushort local_42;
  undefined4 local_40;
  uint local_3c;
  ulong local_38;
  
  iVar2 = (**readable->_vptr_ReadableWav)(readable,&local_64,0x24);
  if ((CONCAT44(extraout_var,iVar2) == 0x24) &&
     (((local_54 == 0x10 ||
       (((local_54 == 0x12 &&
         (iVar2 = (**readable->_vptr_ReadableWav)(readable,&local_88,2),
         CONCAT44(extraout_var_01,iVar2) == 2)) && ((short)local_88 == 0)))) &&
      (iVar2 = (**readable->_vptr_ReadableWav)(readable,&local_40,8),
      CONCAT44(extraout_var_00,iVar2) == 8)))) {
    *format = (uint)local_50;
    *num_channels = (ulong)local_4e;
    *sample_rate = local_4c;
    *bytes_per_sample = (ulong)(local_42 >> 3);
    if (7 < local_42) {
      local_38 = (ulong)local_3c;
      *num_samples = local_38 / (local_42 >> 3);
      local_78 = local_64;
      local_80 = 4;
      local_74 = 0;
      local_88 = &local_78;
      iVar2 = std::__cxx11::string::compare((char *)&local_88);
      if (local_88 != &local_78) {
        operator_delete(local_88);
      }
      if (iVar2 == 0) {
        local_88 = &local_78;
        local_78 = local_5c;
        local_80 = 4;
        local_74 = 0;
        iVar2 = std::__cxx11::string::compare((char *)&local_88);
        if (local_88 != &local_78) {
          operator_delete(local_88);
        }
        if (iVar2 == 0) {
          local_88 = &local_78;
          local_78 = local_58;
          local_80 = 4;
          local_74 = 0;
          iVar2 = std::__cxx11::string::compare((char *)&local_88);
          if (local_88 != &local_78) {
            operator_delete(local_88);
          }
          if (iVar2 == 0) {
            local_88 = &local_78;
            local_78 = local_40;
            local_80 = 4;
            local_74 = 0;
            iVar2 = std::__cxx11::string::compare((char *)&local_88);
            if (local_88 != &local_78) {
              operator_delete(local_88);
            }
            if ((iVar2 == 0) && ((int)local_38 + 0x24U <= local_60)) {
              num_channels_00 = *num_channels;
              bytes_per_sample_00 = *bytes_per_sample;
              if ((local_48 == (int)bytes_per_sample_00 * (int)num_channels_00 * *sample_rate) &&
                 (local_44 == (short)((short)bytes_per_sample_00 * (short)num_channels_00))) {
                bVar1 = CheckWavParameters(num_channels_00,*sample_rate,*format,bytes_per_sample_00,
                                           *num_samples);
                return bVar1;
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ReadWavHeader(ReadableWav* readable,
                   size_t* num_channels,
                   int* sample_rate,
                   WavFormat* format,
                   size_t* bytes_per_sample,
                   size_t* num_samples) {
  WavHeader header;
  if (readable->Read(&header, kWavHeaderSize - sizeof(header.data)) !=
      kWavHeaderSize - sizeof(header.data))
    return false;

  const uint32_t fmt_size = ReadLE32(header.fmt.header.Size);
  if (fmt_size != kFmtSubchunkSize) {
    // There is an optional two-byte extension field permitted to be present
    // with PCM, but which must be zero.
    int16_t ext_size;
    if (kFmtSubchunkSize + sizeof(ext_size) != fmt_size)
      return false;
    if (readable->Read(&ext_size, sizeof(ext_size)) != sizeof(ext_size))
      return false;
    if (ext_size != 0)
      return false;
  }
  if (readable->Read(&header.data, sizeof(header.data)) != sizeof(header.data))
    return false;

  // Parse needed fields.
  *format = static_cast<WavFormat>(ReadLE16(header.fmt.AudioFormat));
  *num_channels = ReadLE16(header.fmt.NumChannels);
  *sample_rate = ReadLE32(header.fmt.SampleRate);
  *bytes_per_sample = ReadLE16(header.fmt.BitsPerSample) / 8;
  const size_t bytes_in_payload = ReadLE32(header.data.header.Size);
  if (*bytes_per_sample == 0)
    return false;
  *num_samples = bytes_in_payload / *bytes_per_sample;

  // Sanity check remaining fields.
  if (ReadFourCC(header.riff.header.ID) != "RIFF")
    return false;
  if (ReadFourCC(header.riff.Format) != "WAVE")
    return false;
  if (ReadFourCC(header.fmt.header.ID) != "fmt ")
    return false;
  if (ReadFourCC(header.data.header.ID) != "data")
    return false;

  if (ReadLE32(header.riff.header.Size) < RiffChunkSize(bytes_in_payload))
    return false;
  if (ReadLE32(header.fmt.ByteRate) !=
      ByteRate(*num_channels, *sample_rate, *bytes_per_sample))
    return false;
  if (ReadLE16(header.fmt.BlockAlign) !=
      BlockAlign(*num_channels, *bytes_per_sample))
    return false;

  return CheckWavParameters(*num_channels, *sample_rate, *format,
                            *bytes_per_sample, *num_samples);
}